

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O2

vector<field::GF2E,_std::allocator<field::GF2E>_> *
field::interpolate_with_precomputation
          (vector<field::GF2E,_std::allocator<field::GF2E>_> *__return_storage_ptr__,
          vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
          *precomputed_lagrange_polynomials,
          vector<field::GF2E,_std::allocator<field::GF2E>_> *y_values)

{
  pointer pvVar1;
  runtime_error *this;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  allocator_type local_48 [24];
  
  pvVar1 = (precomputed_lagrange_polynomials->
           super__Vector_base<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(y_values->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(y_values->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((lVar2 != 0) &&
     (((long)(precomputed_lagrange_polynomials->
             super__Vector_base<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18 == lVar2 >> 3)) {
    std::vector<field::GF2E,_std::allocator<field::GF2E>_>::vector
              (__return_storage_ptr__,
               (long)*(pointer *)
                      ((long)&(pvVar1->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>
                              )._M_impl.super__Vector_impl_data + 8) -
               *(long *)&(pvVar1->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                         _M_impl.super__Vector_impl_data >> 3,local_48);
    lVar4 = (long)(y_values->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(y_values->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar3 = 0;
    lVar2 = 0;
    while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
      operator*((vector<field::GF2E,_std::allocator<field::GF2E>_> *)local_48,
                (vector<field::GF2E,_std::allocator<field::GF2E>_> *)
                ((long)&(((precomputed_lagrange_polynomials->
                          super__Vector_base<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                        super__Vector_impl_data + lVar3),
                (GF2E *)((long)&((y_values->
                                 super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                                 _M_impl.super__Vector_impl_data._M_start)->data + lVar2));
      operator+=(__return_storage_ptr__,
                 (vector<field::GF2E,_std::allocator<field::GF2E>_> *)local_48);
      std::_Vector_base<field::GF2E,_std::allocator<field::GF2E>_>::~_Vector_base
                ((_Vector_base<field::GF2E,_std::allocator<field::GF2E>_> *)local_48);
      lVar2 = lVar2 + 8;
      lVar3 = lVar3 + 0x18;
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"invalid sizes for interpolation");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<GF2E> interpolate_with_precomputation(
    const std::vector<std::vector<GF2E>> &precomputed_lagrange_polynomials,
    const std::vector<GF2E> &y_values) {
  if (precomputed_lagrange_polynomials.size() != y_values.size() ||
      y_values.empty())
    throw std::runtime_error("invalid sizes for interpolation");

  std::vector<GF2E> res(precomputed_lagrange_polynomials[0].size());
  size_t m = y_values.size();
  for (size_t k = 0; k < m; k++) {
    res += precomputed_lagrange_polynomials[k] * y_values[k];
  }
  return res;
}